

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t archive_read_format_lha_read_data_skip(archive_read *a)

{
  void *pvVar1;
  int64_t iVar2;
  wchar_t wVar3;
  
  pvVar1 = a->format->data;
  if (*(long *)((long)pvVar1 + 0x10) != 0) {
    __archive_read_consume(a,*(long *)((long)pvVar1 + 0x10));
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
  }
  wVar3 = L'\0';
  if (*(char *)((long)pvVar1 + 0x12d) == '\0') {
    iVar2 = __archive_read_consume(a,*(int64_t *)((long)pvVar1 + 8));
    if (iVar2 < 0) {
      wVar3 = L'\xffffffe2';
    }
    else {
      *(undefined2 *)((long)pvVar1 + 300) = 0x101;
      wVar3 = L'\0';
    }
  }
  return wVar3;
}

Assistant:

static int
archive_read_format_lha_read_data_skip(struct archive_read *a)
{
	struct lha *lha;
	int64_t bytes_skipped;

	lha = (struct lha *)(a->format->data);

	if (lha->entry_unconsumed) {
		/* Consume as much as the decompressor actually used. */
		__archive_read_consume(a, lha->entry_unconsumed);
		lha->entry_unconsumed = 0;
	}

	/* if we've already read to end of data, we're done. */
	if (lha->end_of_entry_cleanup)
		return (ARCHIVE_OK);

	/*
	 * If the length is at the beginning, we can skip the
	 * compressed data much more quickly.
	 */
	bytes_skipped = __archive_read_consume(a, lha->entry_bytes_remaining);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	/* This entry is finished and done. */
	lha->end_of_entry_cleanup = lha->end_of_entry = 1;
	return (ARCHIVE_OK);
}